

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map)

{
  SUNErrCode SVar1;
  
  SVar1 = 0;
  if ((map != (SUNHashMap *)0x0) &&
     (SVar1 = SUNStlVector_SUNHashMapKeyValue_Destroy(&(*map)->buckets), SVar1 == 0)) {
    free(*map);
    *map = (SUNHashMap)0x0;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map)
{
  if (map == NULL) { return SUN_SUCCESS; }

  SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_Destroy(&(*map)->buckets);
  if (err) { return err; }
  free(*map);
  *map = NULL;

  return SUN_SUCCESS;
}